

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

bool __thiscall ctemplate::Template::ReloadIfChangedLocked(Template *this)

{
  string *resolved;
  HtmlParser *this_00;
  off_t __n;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  File *pFVar4;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  size_type sVar8;
  long lVar9;
  char *pcVar10;
  char *file_buffer;
  size_t buflen;
  FileStat statbuf;
  char *local_d0;
  ulong local_c8;
  FileStat local_c0;
  
  if ((this->original_filename_)._M_string_length == 0) {
    return false;
  }
  resolved = &this->resolved_filename_;
  if ((this->resolved_filename_)._M_string_length == 0) {
    bVar1 = TemplateCache::ResolveTemplateFilename
                      (this->template_cache_,&this->original_filename_,resolved,&local_c0);
    if (bVar1) goto LAB_0011e162;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to locate file ",0x16);
    pcVar10 = (this->original_filename_)._M_dataplus._M_p;
    sVar8 = (this->original_filename_)._M_string_length;
LAB_0011e13b:
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar8)
    ;
    lVar9 = *(long *)poVar3;
  }
  else {
    iVar2 = stat((resolved->_M_dataplus)._M_p,(stat *)&local_c0.internal_statbuf);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to stat file ",0x14);
      pcVar10 = (this->resolved_filename_)._M_dataplus._M_p;
      sVar8 = (this->resolved_filename_)._M_string_length;
      goto LAB_0011e13b;
    }
    local_c0.mtime = local_c0.internal_statbuf.st_mtim.tv_sec;
    local_c0.length = local_c0.internal_statbuf.st_size;
LAB_0011e162:
    if ((local_c0.internal_statbuf.st_mode & 0xf000) == 0x4000) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: ",9);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->resolved_filename_)._M_dataplus._M_p,
                          (this->resolved_filename_)._M_string_length);
      pcVar10 = "is a directory and thus not readable";
      lVar9 = 0x24;
    }
    else {
      if (((local_c0.mtime == this->filename_mtime_) && (0 < this->filename_mtime_)) &&
         (this->tree_ != (SectionTemplateNode *)0x0)) {
        this->state_ = TS_READY;
        return false;
      }
      pFVar4 = File::Open((resolved->_M_dataplus)._M_p,"r");
      __n = local_c0.length;
      if (pFVar4 != (File *)0x0) {
        local_c8 = local_c0.length;
        pcVar10 = (char *)operator_new__(local_c0.length);
        local_d0 = pcVar10;
        sVar5 = fread(pcVar10,1,__n,(FILE *)pFVar4->fp_);
        if (sVar5 == __n) {
          fclose((FILE *)pFVar4->fp_);
          operator_delete(pFVar4);
          this->filename_mtime_ = local_c0.mtime;
          StripBuffer(this,&local_d0,&local_c8);
          this->initial_context_ = TC_MANUAL;
          this_00 = this->htmlparser_;
          if (this_00 != (HtmlParser *)0x0) {
            ctemplate_htmlparser::HtmlParser::~HtmlParser(this_00);
          }
          operator_delete(this_00);
          this->htmlparser_ = (HtmlParser *)0x0;
          bVar1 = BuildTree(this,local_d0,local_d0 + local_c8);
          if (!bVar1) {
            if (this->state_ != TS_READY) {
              return false;
            }
            __assert_fail("state() != TS_READY",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                          ,0xa81,"bool ctemplate::Template::ReloadIfChangedLocked()");
          }
          if (this->state_ != TS_READY) {
            __assert_fail("state() == TS_READY",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                          ,0xa7e,"bool ctemplate::Template::ReloadIfChangedLocked()");
          }
          return true;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error reading file ",0x13);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->resolved_filename_)._M_dataplus._M_p,
                            (this->resolved_filename_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        poVar3 = std::operator<<(poVar3,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar3);
        fclose((FILE *)pFVar4->fp_);
        operator_delete(pFVar4);
        operator_delete__(pcVar10);
        goto LAB_0011e1df;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Can\'t find file ",0x10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->resolved_filename_)._M_dataplus._M_p,
                          (this->resolved_filename_)._M_string_length);
      pcVar10 = "; skipping";
      lVar9 = 10;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar10,lVar9);
    lVar9 = *(long *)poVar3;
  }
  std::ios::widen((char)*(undefined8 *)(lVar9 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
LAB_0011e1df:
  this->state_ = TS_ERROR;
  return false;
}

Assistant:

bool VariableTemplateNode::Expand(ExpandEmitter *output_buffer,
                                  const TemplateDictionaryInterface *dictionary,
                                  PerExpandData* per_expand_data,
                                  const TemplateCache *cache) const {
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitOpenVariable(output_buffer,
                                                   token_.ToString());
  }

  const TemplateString value = dictionary->GetValue(variable_);

  if (AnyMightModify(token_.modvals, per_expand_data)) {
    EmitModifiedString(token_.modvals, value.data(), value.size(),
                       per_expand_data, output_buffer);
  } else {
    // No need to modify value, so just emit it.
    output_buffer->Emit(value.data(), value.size());
  }

  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitCloseVariable(output_buffer);
  }

  return true;
}